

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkcell.c
# Opt level: O2

void * createcell68k(uint type)

{
  DLword *pDVar1;
  LispPTR LVar2;
  uint uVar3;
  LispPTR *base;
  ulong uVar4;
  DLword *pDVar5;
  uint ptr;
  uint uVar6;
  
  pDVar1 = DTDspace;
  uVar6 = type << 4;
  uVar4 = (ulong)(type * 2);
  if (DTDspace[(ulong)uVar6 + uVar4 + 2] == 0) {
    error("createcell : Attempt to create a cell not declared yet");
  }
  while( true ) {
    pDVar5 = Lisp_world;
    ptr = *(uint *)(pDVar1 + (ulong)uVar6 + uVar4 + 4) & 0xfffffff;
    if (ptr != 0) break;
    base = alloc_mdspage(pDVar1[(ulong)uVar6 + uVar4 + 0x11]);
    LVar2 = initmdspage(base,pDVar1[(ulong)uVar6 + uVar4 + 2],0);
    *(LispPTR *)(pDVar1 + (ulong)uVar6 + uVar4 + 4) = LVar2;
    if ((LVar2 >> 0x1b & 1) != 0) {
      error("bad entry on free chain.");
    }
  }
  uVar3 = *(uint *)(Lisp_world + ptr);
  if (uVar3 == 0xe0001) {
    error("N_OP_createcell E0001 error");
    uVar3 = *(uint *)(pDVar5 + ptr);
  }
  *(uint *)(pDVar1 + (ulong)uVar6 + uVar4 + 4) = uVar3 & 0xfffffff;
  if ((uVar3 >> 0x1b & 1) != 0) {
    error("bad entry on free chain.");
  }
  *(int *)(pDVar1 + (ulong)uVar6 + uVar4 + 0xc) = *(int *)(pDVar1 + (ulong)uVar6 + uVar4 + 0xc) + 1;
  pDVar5 = pDVar5 + ptr;
  for (uVar4 = (ulong)((uint)pDVar1[(ulong)uVar6 + uVar4 + 2] * 2); uVar4 != 0; uVar4 = uVar4 - 2) {
    *(undefined2 *)((ulong)pDVar5 ^ 2) = 0;
    pDVar5 = pDVar5 + 1;
  }
  if ((-1 < *(short *)((ulong)(ptr >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
     (*GcDisabled_word != 0x4c)) {
    if (*Reclaim_cnt_word == 0) {
      rec_htfind(ptr,1);
    }
    else {
      htfind(ptr,1);
    }
  }
  return (void *)((ulong)(ptr * 2) + (long)Lisp_world);
}

Assistant:

void *createcell68k(unsigned int type) {
  struct dtd *dtd68k;
  DLword *ptr, *lastptr;
  LispPTR newcell;
#ifdef DTDDEBUG
  if (type == TYPE_LISTP) error("createcell : Can't create Listp cell with CREATECELL");
  if (type == TYPE_STREAM) stab();

  check_dtd_chain(type);

#endif

  dtd68k = (struct dtd *)GetDTD(type);

  if (dtd68k->dtd_size == 0) error("createcell : Attempt to create a cell not declared yet");

retry:
  if ((newcell = (dtd68k->dtd_free & POINTERMASK)) != NIL) {
#ifdef DTDDEBUG
    if (type != GetTypeNumber(newcell)) error("createcell : BAD cell in dtdfree");
    if (newcell > POINTERMASK) error("createcell : BAD Lisp address");
#endif

    ptr = NativeAligned2FromLAddr(newcell);

    if (917505 == *(LispPTR *)ptr) error("N_OP_createcell E0001 error");

    /* replace dtd_free with newcell's top DLword (it may keep next chain)*/
    dtd68k->dtd_free = (*((LispPTR *)ptr)) & POINTERMASK;
    if (dtd68k->dtd_free & 0x8000000) error("bad entry on free chain.");

#ifdef DTDDEBUG
    if ((dtd68k->dtd_free != 0) && (type != GetTypeNumber(dtd68k->dtd_free)))
      error("createcell : BAD cell in next dtdfree");
    check_dtd_chain(type);

#endif

    dtd68k->dtd_oldcnt++;

    /* clear 0  */
    for (lastptr = ptr + dtd68k->dtd_size; ptr != lastptr; ptr++) { GETWORD(ptr) = 0; }

    /*	IncAllocCnt(1); */
    GCLOOKUP(newcell, DELREF);

#ifdef DTDDEBUG
    check_dtd_chain(type);
#endif

    return (NativeAligned2FromLAddr(newcell)); /* XXX: is it really only aligned(2)? */

  } else {
    dtd68k->dtd_free = initmdspage(alloc_mdspage(dtd68k->dtd_typeentry), dtd68k->dtd_size, NIL);
    if (dtd68k->dtd_free & 0x8000000) error("bad entry on free chain.");

#ifdef DTDDEBUG
    check_dtd_chain(type);
#endif

    goto retry;
  }

}